

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.cxx
# Opt level: O1

bool __thiscall
OpenCLKernels::runKernelCalculateFilteredDiff
          (OpenCLKernels *this,UMat *src_diff,uint threshold_1,uint threshold_2,UMat *filtered_diff,
          string *error)

{
  mutex *__mutex;
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_t global_size [2];
  size_t local_size [2];
  uint local_b8;
  uint local_b4;
  Queue local_b0 [8];
  ulong local_a8;
  long local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  KernelArg local_80 [40];
  KernelArg local_58 [40];
  
  local_b8 = threshold_2;
  local_b4 = threshold_1;
  if (this->opencl_available == false) {
    std::__cxx11::string::_M_assign((string *)error);
    cVar1 = '\0';
  }
  else {
    local_a8 = (ulong)*(int *)(src_diff + 0xc);
    local_a0 = (long)*(int *)(src_diff + 8);
    local_98 = 0x10;
    uStack_90 = 0x10;
    __mutex = &this->kernel_calculate_filtered_diff_guard;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      cv::ocl::Queue::~Queue(local_b0);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    cv::ocl::KernelArg::KernelArg(local_58,2,src_diff,1,1,(void *)0x0,0);
    cv::ocl::KernelArg::KernelArg(local_80,0x104,filtered_diff,1,1,(void *)0x0,0);
    iVar2 = (int)this + 0x48;
    uVar3 = cv::ocl::Kernel::set(iVar2,(KernelArg *)0x0);
    uVar3 = cv::ocl::Kernel::set(iVar2,(void *)(ulong)uVar3,(ulong)&local_b4);
    uVar3 = cv::ocl::Kernel::set(iVar2,(void *)(ulong)uVar3,(ulong)&local_b8);
    cv::ocl::Kernel::set(iVar2,(KernelArg *)(ulong)uVar3);
    cv::ocl::Queue::Queue(local_b0);
    cVar1 = cv::ocl::Kernel::run(iVar2,(ulong *)0x2,&local_a8,SUB81(&local_98,0),(Queue *)0x1);
    cv::ocl::Queue::~Queue(local_b0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (cVar1 == '\0') {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x11a3e0);
    }
  }
  return (bool)cVar1;
}

Assistant:

bool
OpenCLKernels::runKernelCalculateFilteredDiff(const UMat &src_diff, unsigned int threshold_1, unsigned int threshold_2,
                                              UMat &filtered_diff, std::string &error)
{
    if(!isAvailable(error)) {
        return false;
    }

    size_t global_size[2] = {(size_t) src_diff.cols, (size_t) src_diff.rows};
    size_t local_size[2] = {16, 16};
    bool execution_result;
    {
        scoped_lock<mutex> lock(kernel_calculate_filtered_diff_guard);
        execution_result = kernel_calculate_filtered_diff.args(
                cv::ocl::KernelArg::ReadOnly(src_diff),
                threshold_1,
                threshold_2,
                cv::ocl::KernelArg::WriteOnlyNoSize(filtered_diff)
        ).run(2, global_size, local_size, true);
    }
    if(!execution_result) {
        error = "OpenCL kernel: kernel_calculate_filtered_diff launch failed.";
        return false;
    }

    return true;
}